

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

Result<wasm::HeapType> *
wasm::WATParser::anon_unknown_11::
typeidx<wasm::WATParser::(anonymous_namespace)::ParseImplicitTypeDefsCtx>
          (Result<wasm::HeapType> *__return_storage_ptr__,ParseImplicitTypeDefsCtx *ctx)

{
  bool bVar1;
  uint *puVar2;
  allocator<char> local_e9;
  string local_e8;
  Err local_c8;
  uint local_a4;
  Err local_a0;
  Err *local_80;
  Err *err;
  undefined1 local_68 [8];
  MaybeResult<unsigned_int> _val;
  MaybeResult<unsigned_int> idx;
  ParseImplicitTypeDefsCtx *ctx_local;
  
  maybeTypeidx<wasm::WATParser::(anonymous_namespace)::ParseImplicitTypeDefsCtx>
            ((MaybeResult<unsigned_int> *)
             ((long)&_val.val.
                     super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
             + 0x20),ctx);
  bVar1 = WATParser::MaybeResult::operator_cast_to_bool
                    ((MaybeResult *)
                     ((long)&_val.val.
                             super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                     + 0x20));
  if (bVar1) {
    MaybeResult<unsigned_int>::MaybeResult
              ((MaybeResult<unsigned_int> *)local_68,
               (MaybeResult<unsigned_int> *)
               ((long)&_val.val.
                       super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
               + 0x20));
    local_80 = MaybeResult<unsigned_int>::getErr((MaybeResult<unsigned_int> *)local_68);
    bVar1 = local_80 != (Err *)0x0;
    if (bVar1) {
      WATParser::Err::Err(&local_a0,local_80);
      Result<wasm::HeapType>::Result(__return_storage_ptr__,&local_a0);
      WATParser::Err::~Err(&local_a0);
    }
    local_a4 = (uint)bVar1;
    MaybeResult<unsigned_int>::~MaybeResult((MaybeResult<unsigned_int> *)local_68);
    if (local_a4 == 0) {
      puVar2 = MaybeResult<unsigned_int>::operator*
                         ((MaybeResult<unsigned_int> *)
                          ((long)&_val.val.
                                  super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                          + 0x20));
      ParseImplicitTypeDefsCtx::getHeapTypeFromIdx(__return_storage_ptr__,ctx,*puVar2);
      local_a4 = 1;
    }
  }
  else {
    local_a4 = 0;
  }
  MaybeResult<unsigned_int>::~MaybeResult
            ((MaybeResult<unsigned_int> *)
             ((long)&_val.val.
                     super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
             + 0x20));
  if (local_a4 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"expected type index or identifier",&local_e9);
    ParseInput::err(&local_c8,&ctx->in,&local_e8);
    Result<wasm::HeapType>::Result(__return_storage_ptr__,&local_c8);
    WATParser::Err::~Err(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::HeapTypeT> typeidx(Ctx& ctx) {
  if (auto idx = maybeTypeidx(ctx)) {
    CHECK_ERR(idx);
    return ctx.getHeapTypeFromIdx(*idx);
  }
  return ctx.in.err("expected type index or identifier");
}